

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_U_invmult_inplace_p(m2v *LU,int rank,m2v *X_inout,int *placements)

{
  uint *puVar1;
  int iVar2;
  m2v_base *pmVar3;
  m2v_base *pmVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  
  if (0 < rank) {
    uVar6 = (ulong)(uint)rank;
    do {
      uVar7 = uVar6 - 1;
      iVar8 = (int)uVar7;
      if (placements != (int *)0x0) {
        iVar8 = placements[uVar7];
      }
      if ((long)uVar6 < (long)LU->n_col) {
        pmVar3 = LU->e;
        uVar9 = uVar6;
        do {
          uVar10 = (uint)uVar9;
          if (placements != (int *)0x0) {
            uVar10 = placements[uVar9];
          }
          if (((pmVar3[(int)(((uint)(uVar9 >> 5) & 0x7ffffff) + LU->row_stride * (int)uVar7)] >>
                ((uint)uVar9 & 0x1f) & 1) != 0) && (iVar2 = X_inout->row_stride, 0 < iVar2)) {
            pmVar4 = X_inout->e;
            lVar11 = 0;
            do {
              puVar1 = pmVar4 + iVar2 * iVar8 + lVar11;
              *puVar1 = *puVar1 ^ pmVar4[(int)(uVar10 * iVar2) + lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 < X_inout->row_stride);
          }
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < LU->n_col);
      }
      bVar5 = 1 < (long)uVar6;
      uVar6 = uVar7;
    } while (bVar5);
  }
  return;
}

Assistant:

void MV_GEN_N(_U_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply U^(-1) */
	for (int i = rank - 1; i >= 0; --i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = i + 1; j < LU->n_col; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
			  MV_GEN_N(_get_el)(LU, i, j),
			  X_inout, pi);
		}
		MV_GEN_N(_mult_row)(X_inout, pi,
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}